

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::compressedteximage2d_invalid_width_height
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_VALUE is generated if target is a cube map face and width and height are not equal."
             ,&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_TEXTURE_CUBE_MAP_POSITIVE_X target",&local_69);
  NegativeTestContext::beginSection(pNVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pNVar1 = local_10;
  iVar2 = divRoundUp(1,4);
  iVar3 = divRoundUp(2,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0x8515,0,0x9270,1,2,0,iVar2 * iVar3 * 8,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"GL_TEXTURE_CUBE_MAP_POSITIVE_Y target",&local_91);
  NegativeTestContext::beginSection(pNVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  pNVar1 = local_10;
  iVar2 = divRoundUp(1,4);
  iVar3 = divRoundUp(2,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0x8517,0,0x9270,1,2,0,iVar2 * iVar3 * 8,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"GL_TEXTURE_CUBE_MAP_POSITIVE_Z target",&local_b9);
  NegativeTestContext::beginSection(pNVar1,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pNVar1 = local_10;
  iVar2 = divRoundUp(1,4);
  iVar3 = divRoundUp(2,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0x8519,0,0x9270,1,2,0,iVar2 * iVar3 * 8,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"GL_TEXTURE_CUBE_MAP_NEGATIVE_X target",&local_e1);
  NegativeTestContext::beginSection(pNVar1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pNVar1 = local_10;
  iVar2 = divRoundUp(1,4);
  iVar3 = divRoundUp(2,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0x8516,0,0x9270,1,2,0,iVar2 * iVar3 * 8,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"GL_TEXTURE_CUBE_MAP_NEGATIVE_Y target",&local_109);
  NegativeTestContext::beginSection(pNVar1,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  pNVar1 = local_10;
  iVar2 = divRoundUp(1,4);
  iVar3 = divRoundUp(2,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0x8518,0,0x9270,1,2,0,iVar2 * iVar3 * 8,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"GL_TEXTURE_CUBE_MAP_NEGATIVE_Z target",&local_131);
  NegativeTestContext::beginSection(pNVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  pNVar1 = local_10;
  iVar2 = divRoundUp(1,4);
  iVar3 = divRoundUp(2,4);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0x851a,0,0x9270,1,2,0,iVar2 * iVar3 * 8,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void compressedteximage2d_invalid_width_height (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if target is a cube map face and width and height are not equal.");

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_POSITIVE_X target");
	ctx.glCompressedTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_COMPRESSED_R11_EAC, 1, 2, 0, divRoundUp(1, 4) * divRoundUp(2, 4) * 8, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_POSITIVE_Y target");
	ctx.glCompressedTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_COMPRESSED_R11_EAC, 1, 2, 0, divRoundUp(1, 4) * divRoundUp(2, 4) * 8, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_POSITIVE_Z target");
	ctx.glCompressedTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_COMPRESSED_R11_EAC, 1, 2, 0, divRoundUp(1, 4) * divRoundUp(2, 4) * 8, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_X target");
	ctx.glCompressedTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_COMPRESSED_R11_EAC, 1, 2, 0, divRoundUp(1, 4) * divRoundUp(2, 4) * 8, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_Y target");
	ctx.glCompressedTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_COMPRESSED_R11_EAC, 1, 2, 0, divRoundUp(1, 4) * divRoundUp(2, 4) * 8, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_Z target");
	ctx.glCompressedTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_COMPRESSED_R11_EAC, 1, 2, 0, divRoundUp(1, 4) * divRoundUp(2, 4) * 8, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.endSection();
}